

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> * __thiscall
embree::XMLLoader::loadVec3iArray
          (vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *__return_storage_ptr__,
          XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  runtime_error *this_01;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  ulong uVar8;
  long lVar9;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ofs","");
    XML::parm(&local_50,this_00,&local_70);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (iVar2 == 0) {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      if (0x5555555555555555 < (ulong)(lVar6 * -0x7b425ed097b425ed)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&xml->ptr->loc);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_50._M_dataplus._M_p == psVar7) {
          local_50.field_2._M_allocated_capacity = *psVar7;
          local_50.field_2._8_8_ = plVar5[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar7;
        }
        local_50._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::resize
                (__return_storage_ptr__,(ulong)(lVar6 * -0x71c71c71c71c71c7) / 3);
      if ((__return_storage_ptr__->
          super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (__return_storage_ptr__->
          super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        lVar9 = 0x90;
        lVar6 = 8;
        uVar8 = 0;
        do {
          iVar2 = Token::Int((Token *)((long)&(xml->ptr->body).
                                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-2].ty +
                                      lVar9));
          iVar3 = Token::Int((Token *)((long)&(xml->ptr->body).
                                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].ty +
                                      lVar9));
          iVar4 = Token::Int((Token *)((long)&((xml->ptr->body).
                                               super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ty +
                                      lVar9));
          pVVar1 = (__return_storage_ptr__->
                   super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)pVVar1 + lVar6 + -8) = iVar2;
          *(int *)((long)pVVar1 + lVar6 + -4) = iVar3;
          *(int *)((long)&pVVar1->field_0 + lVar6) = iVar4;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0xd8;
          lVar6 = lVar6 + 0xc;
        } while (uVar8 < (ulong)(((long)(__return_storage_ptr__->
                                        super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(__return_storage_ptr__->
                                        super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 2) *
                                -0x5555555555555555));
      }
    }
    else {
      loadBinary<std::vector<embree::Vec3<int>,std::allocator<embree::Vec3<int>>>>
                (__return_storage_ptr__,this,xml);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec3i> XMLLoader::loadVec3iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec3i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec3i>>(xml);
    } 
    else 
    {
      std::vector<Vec3i> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3i(xml->body[3*i+0].Int(),xml->body[3*i+1].Int(),xml->body[3*i+2].Int());
      return data;
    }
  }